

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  bool bVar1;
  _Head_base<0UL,_delay_line<float>_*,_false> output_processor;
  __uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_> input_processor;
  uint32_t uVar2;
  cubeb_log_level cVar3;
  cubeb_stream_params *pcVar4;
  cubeb_resampler *pcVar5;
  cubeb_resampler_speex_one_way<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  delay_line<float> *pdVar6;
  cubeb_log_callback p_Var7;
  cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
  *this_01;
  uint source_rate;
  int iVar8;
  _Head_base<0UL,_delay_line<float>_*,_false> _StackY_50;
  __uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_> _StackY_48;
  cubeb_stream_params *pcStackY_40;
  void *pvStackY_38;
  
  pcVar4 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar4 = output_params;
  }
  if (pcVar4->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar4->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar5 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar5;
  }
  _StackY_48._M_t.
  super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
  super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl =
       (tuple<delay_line<float>_*,_std::default_delete<delay_line<float>_>_>)
       (_Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>)0x0;
  _StackY_50._M_head_impl = (delay_line<float> *)0x0;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_00112e18;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_00112ff6:
    cVar3 = cubeb_log_get_level();
    if ((0 < (int)cVar3) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x267,
                         "Resampling output (%dHz) to target and input rate of %dHz",
                         (ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
               *)operator_new(0x48);
    input_processor._M_t.
    super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
    super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl =
         _StackY_48._M_t.
         super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
         super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl;
    _StackY_48._M_t.
    super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
    super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl =
         (tuple<delay_line<float>_*,_std::default_delete<delay_line<float>_>_>)
         (_Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>)0x0;
    cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
    cubeb_resampler_speex
              ((cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                *)this_01,
               (delay_line<float> *)
               input_processor._M_t.
               super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>
               .super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl,this,stream,callback,
               user_ptr);
  }
  else {
    source_rate = input_params->rate;
    if (output_params == (cubeb_stream_params *)0x0 || source_rate != target_rate) {
      if (output_params != (cubeb_stream_params *)0x0) goto LAB_00112e6a;
      if (source_rate == target_rate) goto LAB_00112e1d;
      this = (cubeb_resampler_speex_one_way<float> *)0x0;
      bVar1 = false;
LAB_00112ed4:
      if (source_rate == target_rate) {
LAB_00112f84:
        if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
        }
        else if (bVar1 && input_params != (cubeb_stream_params *)0x0) {
          pdVar6 = (delay_line<float> *)operator_new(0x48);
          uVar2 = cubeb_resampler_speex_one_way<float>::latency(this);
          delay_line<float>::delay_line(pdVar6,uVar2,input_params->channels,output_params->rate);
          std::__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                    (&_StackY_48,pdVar6);
          if (_StackY_48._M_t.
              super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
              super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl ==
              (_Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>)0x0)
          {
            this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
            goto LAB_00113197;
          }
        }
        goto LAB_00112ff6;
      }
      pcStackY_40 = output_params;
      pvStackY_38 = user_ptr;
      this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
      iVar8 = -1;
      if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
        iVar8 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
      }
      cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                (this_00,input_params->channels,source_rate,target_rate,iVar8);
      if ((bool)(bVar1 & input_params != (cubeb_stream_params *)0x0 &
                this == (cubeb_resampler_speex_one_way<float> *)0x0)) {
        pdVar6 = (delay_line<float> *)operator_new(0x48);
        uVar2 = cubeb_resampler_speex_one_way<float>::latency(this_00);
        delay_line<float>::delay_line(pdVar6,uVar2,pcStackY_40->channels,pcStackY_40->rate);
        std::__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                  ((__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                   &_StackY_50,pdVar6);
        if (_StackY_50._M_head_impl == (delay_line<float> *)0x0) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_00113197:
          this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                     *)0x0;
          goto LAB_00113151;
        }
      }
      else if (this != (cubeb_resampler_speex_one_way<float> *)0x0) {
        cVar3 = cubeb_log_get_level();
        if ((0 < (int)cVar3) &&
           (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0)) {
          cubeb_log_internal("cubeb_resampler_internal.h",0x259,
                             "Resampling input (%d) and output (%d) to target rate of %dHz",
                             (ulong)input_params->rate,(ulong)pcStackY_40->rate,(ulong)target_rate);
        }
        this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                   *)operator_new(0x48);
        cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
        ::cubeb_resampler_speex(this_01,this_00,this,stream,callback,pvStackY_38);
        goto LAB_0011314b;
      }
      cVar3 = cubeb_log_get_level();
      if ((0 < (int)cVar3) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x260,
                           "Resampling input (%d) to target and output rate of %dHz",
                           (ulong)input_params->rate,(ulong)target_rate);
      }
      this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                 *)operator_new(0x48);
      output_processor._M_head_impl = _StackY_50._M_head_impl;
      _StackY_50._M_head_impl = (delay_line<float> *)0x0;
      cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::
      cubeb_resampler_speex
                ((cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                  *)this_01,this_00,output_processor._M_head_impl,stream,callback,pvStackY_38);
    }
    else {
LAB_00112e18:
      if (output_params->rate != target_rate) {
LAB_00112e6a:
        uVar2 = output_params->rate;
        if (uVar2 == target_rate) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
        }
        else {
          this = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
          iVar8 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
          if (CUBEB_RESAMPLER_QUALITY_DESKTOP < quality) {
            iVar8 = -1;
          }
          cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                    (this,output_params->channels,target_rate,uVar2,iVar8);
        }
        if (input_params != (cubeb_stream_params *)0x0) {
          source_rate = input_params->rate;
          bVar1 = true;
          goto LAB_00112ed4;
        }
        bVar1 = true;
        goto LAB_00112f84;
      }
LAB_00112e1d:
      cVar3 = cubeb_log_get_level();
      if ((0 < (int)cVar3) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x229,
                           "Input and output sample-rate match, target rate of %dHz",
                           (ulong)target_rate);
      }
      this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                 *)operator_new(0x48);
      if (input_params == (cubeb_stream_params *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = input_params->channels;
      }
      passthrough_resampler<float>::passthrough_resampler
                ((passthrough_resampler<float> *)this_01,stream,callback,user_ptr,uVar2,target_rate)
      ;
    }
  }
LAB_0011314b:
  this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
  this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_00113151:
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)&_StackY_50)
  ;
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)&_StackY_48)
  ;
  if (this != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this->_vptr_cubeb_resampler_speex_one_way[1])(this);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this_00->_vptr_cubeb_resampler_speex_one_way[1])(this_00);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}